

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<unsigned_long> __thiscall kj::anon_unknown_123::AsyncPump::pump(AsyncPump *this)

{
  PromiseArena *pPVar1;
  SourceLocation location;
  OwnPromiseNode OVar2;
  ulong uVar3;
  void *pvVar4;
  undefined8 *in_RSI;
  ulong uVar5;
  SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:116:15)>
  *location_00;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_68;
  anon_class_8_1_8991fb9c_for_func local_60;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  OwnPromiseNode local_48;
  undefined *local_40;
  undefined *puStack_38;
  undefined8 local_30;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  
  uVar3 = in_RSI[2] - in_RSI[3];
  if (uVar3 == 0) {
    Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,in_RSI[2]);
  }
  else {
    uVar5 = 0x1000;
    if (uVar3 < 0x1000) {
      uVar5 = uVar3;
    }
    (**(code **)(*(long *)*in_RSI + 8))(&local_68,(long *)*in_RSI,in_RSI + 4,1,uVar5);
    continuationTracePtr =
         kj::_::
         SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:116:15)>
         ::anon_class_8_1_8991fb9c_for_func::operator();
    pPVar1 = ((local_68.ptr)->super_PromiseArenaMember).arena;
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_68.ptr - (long)pPVar1) < 0x28) {
      pvVar4 = operator_new(0x400);
      location_00 = (SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:116:15)>
                     *)((long)pvVar4 + 0x3d8);
      ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncPump::pump()::_lambda(unsigned_long)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPump::pump()::_lambda(unsigned_long)_1_,void*&>
                (location_00,&local_68,&local_60,&continuationTracePtr);
      *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
    }
    else {
      ((local_68.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
      location_00 = (SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:116:15)>
                     *)&local_68.ptr[-3].super_PromiseArenaMember.arena;
      ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncPump::pump()::_lambda(unsigned_long)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPump::pump()::_lambda(unsigned_long)_1_,void*&>
                (location_00,&local_68,&local_60,&continuationTracePtr);
      local_68.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
    }
    local_40 = &DAT_0042a172;
    puStack_38 = &DAT_0042a1d1;
    local_30 = 0x4c0000058b;
    location.function = &DAT_0042a1d1;
    location.fileName = &DAT_0042a172;
    location.lineNumber = 0x58b;
    location.columnNumber = 0x4c;
    intermediate.ptr = (PromiseNode *)location_00;
    kj::_::maybeChain<unsigned_long>(&local_48,(Promise<unsigned_long> *)&intermediate,location);
    OVar2.ptr = local_48.ptr;
    local_48.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_48);
    this->input = (AsyncInputStream *)OVar2.ptr;
    local_28.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_28);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_68);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<uint64_t> pump() {
    // TODO(perf): This could be more efficient by reading half a buffer at a time and then
    //   starting the next read concurrent with writing the data from the previous read.

    uint64_t n = kj::min(limit - doneSoFar, sizeof(buffer));
    if (n == 0) return doneSoFar;

    return input.tryRead(buffer, 1, n)
        .then([this](size_t amount) -> Promise<uint64_t> {
      if (amount == 0) return doneSoFar;  // EOF
      doneSoFar += amount;
      return output.write(arrayPtr(buffer).first(amount)).then([this]() {
        return pump();
      });
    });
  }